

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O1

bool __thiscall leveldb::log::Reader::SkipToInitialBlock(Reader *this)

{
  Reporter *pRVar1;
  void *in_RAX;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  Status skip_status;
  void *local_28;
  
  uVar2 = this->initial_offset_ & 0xffffffffffff8000;
  uVar3 = uVar2 + 0x8000;
  if (((uint)this->initial_offset_ & 0x7fff) < 0x7ffb) {
    uVar3 = uVar2;
  }
  this->end_of_buffer_offset_ = uVar3;
  bVar4 = true;
  if (uVar3 != 0) {
    local_28 = in_RAX;
    (*this->file_->_vptr_SequentialFile[3])(&local_28,this->file_,uVar3);
    if (local_28 != (void *)0x0) {
      pRVar1 = this->reporter_;
      if ((pRVar1 != (Reporter *)0x0) &&
         (this->initial_offset_ <= this->end_of_buffer_offset_ - ((this->buffer_).size_ + uVar3))) {
        (*pRVar1->_vptr_Reporter[2])(pRVar1,uVar3,&local_28);
      }
      if (local_28 != (void *)0x0) {
        operator_delete__(local_28);
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Reader::SkipToInitialBlock() {
            size_t offset_in_block = initial_offset_ % kBlockSize;
            uint64_t block_start_location = initial_offset_ - offset_in_block;

            // Don't search a block if we'd be in the trailer
            if (offset_in_block > kBlockSize - 6) {
                offset_in_block = 0;
                block_start_location += kBlockSize;
            }

            end_of_buffer_offset_ = block_start_location;

            // Skip to start of first block that can contain the initial record
            if (block_start_location > 0) {
                Status skip_status = file_->Skip(block_start_location);
                if (!skip_status.ok()) {
                    ReportDrop(block_start_location, skip_status);
                    return false;
                }
            }

            return true;
        }